

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

void rec_loop_interp(jit_State *J,BCIns *pc,LoopEvent ev)

{
  int iVar1;
  long lVar2;
  
  if ((J->parent == 0) && (J->exitno == 0)) {
    if ((J->startpc == pc) && (J->framedepth + J->retdepth == 0)) {
      if ((char)(J->cur).startins != 'F') {
        if (ev != LOOPEV_LEAVE) {
          lj_record_stop(J,LJ_TRLINK_LOOP,(uint)(J->cur).traceno);
          return;
        }
        lj_trace_err(J,LJ_TRERR_LLEAVE);
      }
    }
    else if (ev != LOOPEV_LEAVE) {
      if (*(short *)((long)pc + 2) != 0x7fff) {
        lVar2 = 0x72a;
        do {
          if (*(BCIns **)((long)J + lVar2 + -10) == pc) {
            if (((*(ushort *)((long)&(J->cur).nextgc.gcptr64 + lVar2) & 0xfffe) == 8) &&
               (0x8f < *(ushort *)((long)J + lVar2 + -2))) goto LAB_0015242b;
            break;
          }
          lVar2 = lVar2 + 0x10;
        } while (lVar2 != 0xb2a);
        lj_trace_err(J,LJ_TRERR_LINNER);
      }
LAB_0015242b:
      if (((ev != LOOPEV_ENTERLO) && ((J->loopref != 0 && (0x18 < (J->cur).nins - J->loopref)))) ||
         (iVar1 = J->loopunroll, J->loopunroll = iVar1 + -1, iVar1 < 1)) goto LAB_00152465;
      J->loopref = (J->cur).nins;
    }
  }
  else if (ev != LOOPEV_LEAVE) {
    iVar1 = J->loopunroll;
    J->loopref = (J->cur).nins;
    J->loopunroll = iVar1 + -1;
    if (iVar1 < 1) {
LAB_00152465:
      lj_trace_err(J,LJ_TRERR_LUNROLL);
    }
  }
  return;
}

Assistant:

static void rec_loop_interp(jit_State *J, const BCIns *pc, LoopEvent ev)
{
  if (J->parent == 0 && J->exitno == 0) {
    if (pc == J->startpc && J->framedepth + J->retdepth == 0) {
      if (bc_op(J->cur.startins) == BC_ITERN) return;  /* See rec_itern(). */
      /* Same loop? */
      if (ev == LOOPEV_LEAVE)  /* Must loop back to form a root trace. */
	lj_trace_err(J, LJ_TRERR_LLEAVE);
      lj_record_stop(J, LJ_TRLINK_LOOP, J->cur.traceno);  /* Looping trace. */
    } else if (ev != LOOPEV_LEAVE) {  /* Entering inner loop? */
      /* It's usually better to abort here and wait until the inner loop
      ** is traced. But if the inner loop repeatedly didn't loop back,
      ** this indicates a low trip count. In this case try unrolling
      ** an inner loop even in a root trace. But it's better to be a bit
      ** more conservative here and only do it for very short loops.
      */
      if (bc_j(*pc) != -1 && !innerloopleft(J, pc))
	lj_trace_err(J, LJ_TRERR_LINNER);  /* Root trace hit an inner loop. */
      if ((ev != LOOPEV_ENTERLO &&
	   J->loopref && J->cur.nins - J->loopref > 24) || --J->loopunroll < 0)
	lj_trace_err(J, LJ_TRERR_LUNROLL);  /* Limit loop unrolling. */
      J->loopref = J->cur.nins;
    }
  } else if (ev != LOOPEV_LEAVE) {  /* Side trace enters an inner loop. */
    J->loopref = J->cur.nins;
    if (--J->loopunroll < 0)
      lj_trace_err(J, LJ_TRERR_LUNROLL);  /* Limit loop unrolling. */
  }  /* Side trace continues across a loop that's left or not entered. */
}